

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_merge.hpp
# Opt level: O1

void __thiscall
optimization::mergeBlocks::Merge_Block::optimize_func(Merge_Block *this,MirFunction *func)

{
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar2;
  int *piVar3;
  _Base_ptr *__k;
  undefined1 uVar4;
  JumpKind JVar5;
  _Base_ptr p_Var6;
  _Self __tmp_1;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  _Rb_tree_node_base *p_Var10;
  size_type sVar11;
  mapped_type *pmVar12;
  bool bVar13;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Base_ptr p_Var14;
  int iVar15;
  _Self __tmp;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar16;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  pVar17;
  uint32_t local_4c;
  
  this_00 = &func->basic_blks;
  p_Var1 = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header;
  do {
    bVar13 = false;
    for (p_Var10 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != p_Var1;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      iVar15 = 5;
      if (*(int *)&p_Var10[1]._M_left < 0x186a1) {
        if (*(long *)(p_Var10 + 3) == 1) {
          pmVar7 = std::
                   map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                   ::at(this_00,(key_type *)(p_Var10[2]._M_left + 1));
          if (*(int *)&p_Var10[4]._M_parent == 1) {
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(&p_Var1->_M_header);
            lVar9 = std::_Rb_tree_decrement(p_Var8);
            if (pmVar7->id != *(int *)(lVar9 + 0x20)) goto LAB_001280b6;
          }
          if (((pmVar7->jump).kind == Br) &&
             (__k = &p_Var10[1]._M_left, (pmVar7->jump).bb_true == *(int *)__k)) {
            p_Var14 = p_Var10[3]._M_parent;
            p_Var6 = p_Var10[3]._M_left;
            if (p_Var14 != p_Var6) {
              do {
                std::
                vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                ::
                emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                          ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                            *)&pmVar7->inst,
                           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           p_Var14);
                p_Var14 = (_Base_ptr)&p_Var14->_M_parent;
              } while (p_Var14 != p_Var6);
            }
            p_Var14 = p_Var10[5]._M_parent;
            uVar4 = (undefined1)p_Var10[5]._M_color;
            if (uVar4 == _S_black) {
              local_4c = *(uint32_t *)&p_Var10[4]._M_right;
            }
            JVar5 = *(JumpKind *)&p_Var10[5]._M_left;
            (pmVar7->jump).kind = *(JumpInstructionKind *)&p_Var10[4]._M_parent;
            bVar13 = (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>
                     ._M_payload.super__Optional_payload_base<mir::inst::VarId>._M_engaged;
            if ((bVar13 == true) && (uVar4 != _S_red)) {
              (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
              _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id =
                   local_4c;
            }
            else if (uVar4 == _S_red) {
              if (bVar13 != false) {
                (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
                _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_engaged = false;
              }
            }
            else {
              (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
              _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.
              super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
              (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
              _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id =
                   local_4c;
              (pmVar7->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
              _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
            }
            piVar3 = &(pmVar7->jump).bb_true;
            *(_Base_ptr *)&(pmVar7->jump).bb_true = p_Var14;
            (pmVar7->jump).jump_kind = JVar5;
            sVar11 = std::
                     map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                     ::count(this_00,piVar3);
            if (sVar11 != 0) {
              pmVar12 = std::
                        map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                        ::at(this_00,piVar3);
              psVar2 = &pmVar12->preceding;
              pVar16 = std::
                       _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       ::equal_range(&psVar2->_M_t,(key_type *)__k);
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_erase_aux(&psVar2->_M_t,(_Base_ptr)pVar16.first._M_node,
                           (_Base_ptr)pVar16.second._M_node);
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )psVar2,&pmVar7->id);
            }
            piVar3 = &(pmVar7->jump).bb_false;
            sVar11 = std::
                     map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                     ::count(this_00,piVar3);
            if (sVar11 != 0) {
              pmVar12 = std::
                        map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                        ::at(this_00,piVar3);
              psVar2 = &pmVar12->preceding;
              pVar16 = std::
                       _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       ::equal_range(&psVar2->_M_t,(key_type *)__k);
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_erase_aux(&psVar2->_M_t,(_Base_ptr)pVar16.first._M_node,
                           (_Base_ptr)pVar16.second._M_node);
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )psVar2,&pmVar7->id);
            }
            pVar17 = std::
                     _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                     ::equal_range(&this_00->_M_t,(key_type *)__k);
            std::
            _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar17.first._M_node,
                           (_Base_ptr)pVar17.second._M_node);
            bVar13 = true;
            iVar15 = 4;
            goto LAB_001280b6;
          }
        }
        iVar15 = 0;
      }
LAB_001280b6:
      if ((iVar15 != 5) && (iVar15 != 0)) break;
    }
    if (!bVar13) {
      return;
    }
  } while( true );
}

Assistant:

void optimize_func(mir::inst::MirFunction& func) {
    while (true) {
      bool flag = false;
      for (auto& blkiter : func.basic_blks) {
        auto& blk = blkiter.second;
        if (blk.id > 100000) {
          continue;
        }
        if (blk.preceding.size() == 1) {
          auto& preBlk = func.basic_blks.at(*blk.preceding.begin());
          auto end_iter = func.basic_blks.end();
          end_iter--;
          end_iter--;
          if (blk.jump.kind == mir::inst::JumpInstructionKind::Return &&
              preBlk.id !=
                  end_iter->first) {  // in this case, merge will cause the
                                      // end block's id is not the largest
            continue;
          }

          if (preBlk.jump.kind == mir::inst::JumpInstructionKind::Br &&
              preBlk.jump.bb_true == blk.id) {
            for (auto& inst : blk.inst) {
              preBlk.inst.push_back(std::move(inst));
            }
            preBlk.jump = mir::inst::JumpInstruction(
                blk.jump.kind, blk.jump.bb_true, blk.jump.bb_false,
                blk.jump.cond_or_ret, blk.jump.jump_kind);
            if (func.basic_blks.count(preBlk.jump.bb_true)) {
              auto& subBlk = func.basic_blks.at(preBlk.jump.bb_true);
              subBlk.preceding.erase(blk.id);
              subBlk.preceding.insert(preBlk.id);
            }
            if (func.basic_blks.count(preBlk.jump.bb_false)) {
              auto& subBlk = func.basic_blks.at(preBlk.jump.bb_false);
              subBlk.preceding.erase(blk.id);
              subBlk.preceding.insert(preBlk.id);
            }
            flag = true;
            func.basic_blks.erase(blk.id);
            break;
          }
        }
      }
      if (!flag) {
        break;
      }
    }
  }